

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_description_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  bool bVar1;
  ulong uVar2;
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator local_e1;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  size_t local_60;
  size_t max_options;
  size_t local_48;
  size_t min_options;
  string desc;
  App *app_local;
  Formatter *this_local;
  
  desc.field_2._8_8_ = app;
  App::get_description_abi_cxx11_((string *)&min_options,app);
  local_48 = App::get_require_option_min((App *)desc.field_2._8_8_);
  local_60 = App::get_require_option_max((App *)desc.field_2._8_8_);
  bVar1 = App::get_required((App *)desc.field_2._8_8_);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_e0,"REQUIRED",&local_e1);
    FormatterBase::get_label(&local_c0,&this->super_FormatterBase,&local_e0);
    ::std::operator+(&local_a0," ",&local_c0);
    ::std::operator+(&local_80,&local_a0," ");
    ::std::__cxx11::string::operator+=((string *)&min_options,(string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  if (local_48 == 0) {
    if (local_60 != 0) {
      std::__cxx11::to_string(&local_2c8,local_60);
      ::std::operator+(&local_2a8," \n[At most ",&local_2c8);
      ::std::operator+(&local_288,&local_2a8," of the following options are allowed]");
      ::std::__cxx11::string::operator+=((string *)&min_options,(string *)&local_288);
      ::std::__cxx11::string::~string((string *)&local_288);
      ::std::__cxx11::string::~string((string *)&local_2a8);
      ::std::__cxx11::string::~string((string *)&local_2c8);
    }
  }
  else if (local_60 == local_48) {
    std::__cxx11::to_string(&local_148,local_48);
    ::std::operator+(&local_128," \n[Exactly ",&local_148);
    ::std::operator+(&local_108,&local_128," of the following options are required]");
    ::std::__cxx11::string::operator+=((string *)&min_options,(string *)&local_108);
    ::std::__cxx11::string::~string((string *)&local_108);
    ::std::__cxx11::string::~string((string *)&local_128);
    ::std::__cxx11::string::~string((string *)&local_148);
  }
  else if (local_60 == 0) {
    std::__cxx11::to_string(&local_268,local_48);
    ::std::operator+(&local_248," \n[At least ",&local_268);
    ::std::operator+(&local_228,&local_248," of the following options are required]");
    ::std::__cxx11::string::operator+=((string *)&min_options,(string *)&local_228);
    ::std::__cxx11::string::~string((string *)&local_228);
    ::std::__cxx11::string::~string((string *)&local_248);
    ::std::__cxx11::string::~string((string *)&local_268);
  }
  else {
    std::__cxx11::to_string(&local_1e8,local_48);
    ::std::operator+(&local_1c8," \n[Between ",&local_1e8);
    ::std::operator+(&local_1a8,&local_1c8," and ");
    std::__cxx11::to_string(&local_208,local_60);
    ::std::operator+(&local_188,&local_1a8,&local_208);
    ::std::operator+(&local_168,&local_188," of the following options are required]");
    ::std::__cxx11::string::operator+=((string *)&min_options,(string *)&local_168);
    ::std::__cxx11::string::~string((string *)&local_168);
    ::std::__cxx11::string::~string((string *)&local_188);
    ::std::__cxx11::string::~string((string *)&local_208);
    ::std::__cxx11::string::~string((string *)&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1c8);
    ::std::__cxx11::string::~string((string *)&local_1e8);
  }
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ::std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &min_options,"\n\n");
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::~string((string *)&min_options);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_description(const App *app) const {
    std::string desc = app->get_description();
    auto min_options = app->get_require_option_min();
    auto max_options = app->get_require_option_max();

    if(app->get_required()) {
        desc += " " + get_label("REQUIRED") + " ";
    }

    if(min_options > 0) {
        if(max_options == min_options) {
            desc += " \n[Exactly " + std::to_string(min_options) + " of the following options are required]";
        } else if(max_options > 0) {
            desc += " \n[Between " + std::to_string(min_options) + " and " + std::to_string(max_options) +
                    " of the following options are required]";
        } else {
            desc += " \n[At least " + std::to_string(min_options) + " of the following options are required]";
        }
    } else if(max_options > 0) {
        desc += " \n[At most " + std::to_string(max_options) + " of the following options are allowed]";
    }

    return (!desc.empty()) ? desc + "\n\n" : std::string{};
}